

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void __thiscall
wasm::
CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
::doEndResume(CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
              *this,LocalGraphFlower *self,Expression **currp)

{
  Module *pMVar1;
  mapped_type *this_00;
  _Base_ptr p_Var2;
  NameSet *extraout_RDX;
  undefined1 local_78 [8];
  NameSet handlerBlocks;
  Name target;
  
  pMVar1 = (this->
           super_PostWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>_>
           ).
           super_Walker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>_>
           .currModule;
  if ((pMVar1 == (Module *)0x0) || (((pMVar1->features).features & 0x40) != 0)) {
    doEndThrowingInst((LocalGraphFlower *)this,(Expression **)self);
    currp = (Expression **)extraout_RDX;
  }
  handlerBlocks._M_t._M_impl._0_4_ = 0;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Rb_tree_node_base *)&handlerBlocks;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&handlerBlocks;
  BranchUtils::
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            ((BranchUtils *)
             (self->
             super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
             ).
             super_PostWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>_>
             .
             super_Walker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>_>
             .replacep,(Expression *)local_78,(anon_class_8_1_ba1d7401)currp);
  if (handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Rb_tree_node_base *)&handlerBlocks) {
    p_Var2 = handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var2 + 1);
      this_00 = std::
                map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>_>
                ::operator[](&this->branches,
                             (key_type *)
                             &handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
      ::push_back(this_00,&this->currBasicBlock);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)&handlerBlocks);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_78);
  return;
}

Assistant:

static void doEndResume(SubType* self, Expression** currp) {
    auto* module = self->getModule();
    if (!module || module->features.hasExceptionHandling()) {
      // This resume might throw, so run the code to handle that.
      doEndThrowingInst(self, currp);
    }
    auto handlerBlocks = BranchUtils::getUniqueTargets(*currp);
    // Add branches to the targets.
    for (auto target : handlerBlocks) {
      self->branches[target].push_back(self->currBasicBlock);
    }
  }